

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

DescriptorPoolWrapper * __thiscall
Diligent::DescriptorPoolManager::GetPool
          (DescriptorPoolWrapper *__return_storage_ptr__,DescriptorPoolManager *this,char *DebugName
          )

{
  bool bVar1;
  VulkanLogicalDevice *this_00;
  reference rhs;
  VkDevice device;
  VkDescriptorPool_T *descriptorPool;
  VulkanLogicalDevice *LogicalDevice;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> Lock;
  char *DebugName_local;
  DescriptorPoolManager *this_local;
  DescriptorPoolWrapper *Pool;
  
  Lock._M_device = (mutex_type *)DebugName;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_Mutex);
  std::__atomic_base<int>::operator++(&(this->m_AllocatedPoolCounter).super___atomic_base<int>);
  bVar1 = std::
          deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
          ::empty(&this->m_Pools);
  if (bVar1) {
    CreateDescriptorPool(__return_storage_ptr__,this,(char *)Lock._M_device);
  }
  else {
    this_00 = RenderDeviceVkImpl::GetLogicalDevice(this->m_DeviceVkImpl);
    rhs = std::
          deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
          ::front(&this->m_Pools);
    VulkanUtilities::
    VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
    VulkanObjectWrapper(__return_storage_ptr__,rhs);
    device = VulkanUtilities::VulkanLogicalDevice::GetVkDevice(this_00);
    descriptorPool =
         VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                   ((VulkanObjectWrapper *)__return_storage_ptr__);
    VulkanUtilities::SetDescriptorPoolName(device,descriptorPool,(char *)Lock._M_device);
    std::
    deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
    ::pop_front(&this->m_Pools);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::DescriptorPoolWrapper DescriptorPoolManager::GetPool(const char* DebugName)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedPoolCounter;
#endif
    if (m_Pools.empty())
        return CreateDescriptorPool(DebugName);
    else
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_DeviceVkImpl.GetLogicalDevice();
        VulkanUtilities::DescriptorPoolWrapper      Pool          = std::move(m_Pools.front());
        VulkanUtilities::SetDescriptorPoolName(LogicalDevice.GetVkDevice(), Pool, DebugName);
        m_Pools.pop_front();
        return Pool;
    }
}